

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O0

void xLearn::CheckLR(DMatrix *matrix,bool has_label,bool disk)

{
  bool bVar1;
  char *pcVar2;
  const_reference ppvVar3;
  byte in_DL;
  byte in_SIL;
  long in_RDI;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  float in_stack_00000158;
  float in_stack_0000015c;
  AssertionResult gtest_ar_5;
  iterator iter;
  int n;
  SparseRow *row;
  int i;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *in_stack_fffffffffffffd98;
  AssertionResult *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  char *in_stack_fffffffffffffdb0;
  AssertionResult *in_stack_fffffffffffffdb8;
  AssertHelper local_190;
  Message local_188;
  undefined4 local_17c;
  AssertionResult local_178;
  AssertHelper local_168;
  Message local_160;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140;
  undefined4 local_134;
  AssertionResult local_130;
  AssertHelper local_120;
  Message local_118;
  undefined4 local_10c;
  AssertionResult local_108;
  Node *local_f8;
  __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_f0;
  int local_e4;
  value_type local_e0;
  uint local_d4;
  AssertHelper local_d0;
  Message local_c8;
  AssertionResult local_c0;
  AssertHelper local_b0;
  Message local_a8;
  undefined4 local_9c;
  AssertionResult local_98;
  AssertHelper local_88;
  Message local_80;
  undefined4 local_74;
  AssertionResult local_70;
  AssertHelper local_60;
  Message local_58;
  AssertionResult local_50;
  AssertHelper local_40;
  Message local_38 [3];
  AssertionResult local_20;
  byte local_a;
  byte local_9;
  long local_8;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  local_8 = in_RDI;
  if (local_a == 0) {
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              (&in_stack_fffffffffffffdb8->success_,in_stack_fffffffffffffdb0,
               (uint *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
               (uint *)in_stack_fffffffffffffda0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_50);
    if (!bVar1) {
      testing::Message::Message(&local_58);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x15015a);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
                 ,0x8e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      testing::Message::~Message((Message *)0x1501bd);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x150212);
  }
  else {
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              (&in_stack_fffffffffffffdb8->success_,in_stack_fffffffffffffdb0,
               (uint *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
               (uint *)in_stack_fffffffffffffda0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
    if (!bVar1) {
      testing::Message::Message(local_38);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x14fff8);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
                 ,0x8c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_40,local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      testing::Message::~Message((Message *)0x15005b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1500b0);
  }
  if ((local_9 & 1) == 0) {
    std::vector<float,_std::allocator<float>_>::operator[]
              ((vector<float,_std::allocator<float>_> *)(local_8 + 0x30),0);
    local_9c = 0xfffffffe;
    testing::internal::EqHelper<false>::Compare<float,int>
              (&in_stack_fffffffffffffdb8->success_,in_stack_fffffffffffffdb0,
               (float *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
               (int *)in_stack_fffffffffffffda0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
    if (!bVar1) {
      testing::Message::Message(&local_a8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x150459);
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
                 ,0x94,pcVar2);
      testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      testing::Message::~Message((Message *)0x1504b6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x15050b);
  }
  else {
    std::vector<float,_std::allocator<float>_>::operator[]
              ((vector<float,_std::allocator<float>_> *)(local_8 + 0x30),0);
    local_74 = 0;
    testing::internal::EqHelper<false>::Compare<float,int>
              (&in_stack_fffffffffffffdb8->success_,in_stack_fffffffffffffdb0,
               (float *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
               (int *)in_stack_fffffffffffffda0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
    if (!bVar1) {
      testing::Message::Message(&local_80);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1502df);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
                 ,0x92,pcVar2);
      testing::internal::AssertHelper::operator=(&local_88,&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      testing::Message::~Message((Message *)0x150342);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x150397);
  }
  std::vector<float,_std::allocator<float>_>::operator[]
            ((vector<float,_std::allocator<float>_> *)(local_8 + 0x48),0);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((char *)gtest_ar_5.message_.ptr_,(char *)gtest_ar_5._0_8_,in_stack_0000015c,
             in_stack_00000158);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1505b4);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
               ,0x96,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message((Message *)0x150611);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x150669);
  for (local_d4 = 0; local_d4 < *(uint *)(local_8 + 0x10); local_d4 = local_d4 + 1) {
    ppvVar3 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                            *)(local_8 + 0x18),(long)(int)local_d4);
    local_e0 = *ppvVar3;
    local_e4 = 0;
    local_f0._M_current =
         (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                           (in_stack_fffffffffffffd98);
    while( true ) {
      local_f8 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                   (in_stack_fffffffffffffd98);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                          *)in_stack_fffffffffffffda0,
                         (__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                          *)in_stack_fffffffffffffd98);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator->(&local_f0);
      local_10c = 0;
      testing::internal::EqHelper<false>::Compare<unsigned_int,int>
                (&in_stack_fffffffffffffdb8->success_,in_stack_fffffffffffffdb0,
                 (uint *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                 (int *)in_stack_fffffffffffffda0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
      if (!bVar1) {
        testing::Message::Message(&local_118);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1507ac);
        testing::internal::AssertHelper::AssertHelper
                  (&local_120,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
                   ,0x9c,pcVar2);
        testing::internal::AssertHelper::operator=(&local_120,&local_118);
        testing::internal::AssertHelper::~AssertHelper(&local_120);
        testing::Message::~Message((Message *)0x150809);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x15085e);
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator->(&local_f0);
      local_134 = 1;
      testing::internal::EqHelper<false>::Compare<unsigned_int,int>
                (&in_stack_fffffffffffffdb8->success_,in_stack_fffffffffffffdb0,
                 (uint *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                 (int *)in_stack_fffffffffffffda0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
      if (!bVar1) {
        testing::Message::Message(&local_140);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x15090b);
        testing::internal::AssertHelper::AssertHelper
                  (&local_148,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
                   ,0x9d,pcVar2);
        testing::internal::AssertHelper::operator=(&local_148,&local_140);
        testing::internal::AssertHelper::~AssertHelper(&local_148);
        testing::Message::~Message((Message *)0x150968);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1509bd);
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator->(&local_f0);
      in_stack_fffffffffffffdb8 = &local_158;
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((char *)gtest_ar_5.message_.ptr_,(char *)gtest_ar_5._0_8_,in_stack_0000015c,
                 in_stack_00000158);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffdb8);
      if (!bVar1) {
        testing::Message::Message(&local_160);
        in_stack_fffffffffffffdb0 =
             testing::AssertionResult::failure_message((AssertionResult *)0x150a5d);
        testing::internal::AssertHelper::AssertHelper
                  (&local_168,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
                   ,0x9e,in_stack_fffffffffffffdb0);
        testing::internal::AssertHelper::operator=(&local_168,&local_160);
        testing::internal::AssertHelper::~AssertHelper(&local_168);
        testing::Message::~Message((Message *)0x150aba);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x150b0f);
      local_e4 = local_e4 + 1;
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator++(&local_f0);
    }
    local_17c = 3;
    in_stack_fffffffffffffda0 = &local_178;
    testing::internal::EqHelper<false>::Compare<int,int>
              (&in_stack_fffffffffffffdb8->success_,in_stack_fffffffffffffdb0,
               (int *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
               (int *)in_stack_fffffffffffffda0);
    in_stack_fffffffffffffdaf =
         testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffda0);
    if (!(bool)in_stack_fffffffffffffdaf) {
      testing::Message::Message(&local_188);
      in_stack_fffffffffffffd98 =
           (vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x150bd3);
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
                 ,0xa1,(char *)in_stack_fffffffffffffd98);
      testing::internal::AssertHelper::operator=(&local_190,&local_188);
      testing::internal::AssertHelper::~AssertHelper(&local_190);
      testing::Message::~Message((Message *)0x150c2e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x150c83);
  }
  return;
}

Assistant:

void CheckLR(const DMatrix* matrix, bool has_label, bool disk) {
  if (disk) {
    EXPECT_EQ(matrix->row_length, kNumLines);
  } else {
    EXPECT_EQ(matrix->row_length, kNumLines);
  }
  // check the first element
  if (has_label) {
    EXPECT_EQ(matrix->Y[0], 0);
  } else {
    EXPECT_EQ(matrix->Y[0], -2);
  }
  EXPECT_FLOAT_EQ(matrix->norm[0], 22.03274);
  for (int i = 0; i < matrix->row_length; ++i) {
    SparseRow *row = matrix->row[i];
    int n = 0;
    for (SparseRow::iterator iter = row->begin();
         iter != row->end(); ++iter) {
      EXPECT_EQ(iter->field_id, 0);
      EXPECT_EQ(iter->feat_id, 1);
      EXPECT_FLOAT_EQ(iter->feat_val, 0.123);
      n++;
    }
    EXPECT_EQ(n, 3);
  }
}